

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O2

int WebPWrite16bAsPGM(FILE *fout,WebPDecBuffer *buffer)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  uint8_t *__ptr;
  uint uVar4;
  bool bVar5;
  
  iVar2 = 0;
  if ((buffer != (WebPDecBuffer *)0x0 && fout != (FILE *)0x0) &&
     (__ptr = (buffer->u).RGBA.rgba, iVar2 = 0, __ptr != (uint8_t *)0x0)) {
    uVar4 = buffer->height;
    iVar2 = (buffer->u).RGBA.stride;
    uVar1 = buffer->width;
    fprintf((FILE *)fout,"P5\n%u %u\n255\n",(ulong)(uVar1 * 2),(ulong)uVar4,in_R8,in_R9,0);
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      sVar3 = fwrite(__ptr,(ulong)uVar1,2,(FILE *)fout);
      if (sVar3 != 2) {
        return 0;
      }
      __ptr = __ptr + iVar2;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int WebPWrite16bAsPGM(FILE* fout, const WebPDecBuffer* const buffer) {
  uint32_t width, height;
  uint8_t* rgba;
  int stride;
  const uint32_t bytes_per_px = 2;
  uint32_t y;

  if (fout == NULL || buffer == NULL) return 0;

  width = buffer->width;
  height = buffer->height;
  rgba = buffer->u.RGBA.rgba;
  stride = buffer->u.RGBA.stride;

  if (rgba == NULL) return 0;

  fprintf(fout, "P5\n%u %u\n255\n", width * bytes_per_px, height);
  for (y = 0; y < height; ++y) {
    if (fwrite(rgba, width, bytes_per_px, fout) != bytes_per_px) {
      return 0;
    }
    rgba += stride;
  }
  return 1;
}